

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O2

bool __thiscall QFileSystemEntry::isRelative(QFileSystemEntry *this)

{
  bool bVar1;
  
  bVar1 = isAbsolute(this);
  return !bVar1;
}

Assistant:

bool QFileSystemEntry::isRelative() const
{
    return !isAbsolute();
}